

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec3 closest_point_point_triangle(vec3 p,vec3 a,vec3 b,vec3 c,triangle_contact_type_t *type)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  vec3 vVar26;
  
  fVar18 = c.z;
  fVar12 = b.z;
  fVar10 = b.x;
  fVar11 = b.y;
  fVar19 = a.z;
  uVar6 = a._0_8_;
  fVar4 = p.z;
  fVar24 = c.x;
  fVar9 = c.y;
  fVar16 = p.x;
  fVar2 = p.y;
  fVar5 = a.x;
  fVar7 = a.y;
  fVar20 = fVar10 - fVar5;
  fVar13 = fVar11 - fVar7;
  fVar22 = fVar12 - fVar19;
  fVar21 = fVar22 * (fVar4 - fVar19) + fVar20 * (fVar16 - fVar5) + (fVar2 - fVar7) * fVar13;
  fVar23 = fVar24 - fVar5;
  fVar14 = fVar9 - fVar7;
  fVar25 = fVar18 - fVar19;
  fVar3 = (fVar4 - fVar19) * fVar25 + (fVar16 - fVar5) * fVar23 + (fVar2 - fVar7) * fVar14;
  if ((0.0 < fVar21) || (0.0 < fVar3)) {
    uVar6 = b._0_8_;
    fVar8 = fVar22 * (fVar4 - fVar12) + fVar20 * (fVar16 - fVar10) + fVar13 * (fVar2 - fVar11);
    fVar15 = (fVar4 - fVar12) * fVar25 + (fVar16 - fVar10) * fVar23 + (fVar2 - fVar11) * fVar14;
    if ((fVar8 < 0.0) || (fVar8 < fVar15)) {
      fVar17 = fVar21 * fVar15 - fVar3 * fVar8;
      if (((-fVar8 < fVar8) || (fVar21 < 0.0)) || (0.0 < fVar17)) {
        fVar1 = fVar22 * (fVar4 - fVar18) + fVar20 * (fVar16 - fVar24) + fVar13 * (fVar2 - fVar9);
        fVar16 = (fVar4 - fVar18) * fVar25 + (fVar16 - fVar24) * fVar23 + (fVar2 - fVar9) * fVar14;
        if ((fVar16 < 0.0) || (fVar16 < fVar1)) {
          fVar2 = fVar1 * fVar3 - fVar21 * fVar16;
          if ((fVar16 <= 0.0) && ((fVar2 <= 0.0 && (0.0 <= fVar3)))) {
            *type = TRIANGLE_CONTACT_AC;
            fVar3 = fVar3 / (fVar3 - fVar16);
            uVar6 = CONCAT44(fVar7 + fVar14 * fVar3,fVar5 + fVar23 * fVar3);
            fVar19 = fVar19 + fVar25 * fVar3;
            goto LAB_001347c3;
          }
          fVar4 = fVar8 * fVar16 - fVar15 * fVar1;
          if (((0.0 < fVar4) || (fVar15 = fVar15 - fVar8, fVar15 < 0.0)) || (fVar1 - fVar16 < 0.0))
          {
            *type = TRIANGLE_CONTACT_FACE;
            fVar16 = 1.0 / (fVar4 + fVar2 + fVar17);
            fVar2 = fVar2 * fVar16;
            fVar16 = fVar16 * fVar17;
            fVar19 = fVar25 * fVar16 + fVar22 * fVar2 + fVar19;
            uVar6 = CONCAT44(fVar14 * fVar16 + fVar7 + fVar13 * fVar2,
                             fVar23 * fVar16 + fVar5 + fVar20 * fVar2);
            goto LAB_001347c3;
          }
          *type = TRIANGLE_CONTACT_BC;
          fVar15 = fVar15 / ((fVar1 - fVar16) + fVar15);
          fVar24 = (fVar24 - fVar10) * fVar15 + fVar10;
          fVar9 = (fVar9 - fVar11) * fVar15 + fVar11;
          fVar18 = (fVar18 - fVar12) * fVar15 + fVar12;
        }
        else {
          *type = TRIANGLE_CONTACT_C;
        }
        uVar6 = CONCAT44(fVar9,fVar24);
        fVar19 = fVar18;
      }
      else {
        *type = TRIANGLE_CONTACT_AB;
        fVar21 = fVar21 / (fVar21 - fVar8);
        uVar6 = CONCAT44(fVar7 + fVar13 * fVar21,fVar5 + fVar20 * fVar21);
        fVar19 = fVar19 + fVar22 * fVar21;
      }
    }
    else {
      *type = TRIANGLE_CONTACT_B;
      fVar19 = fVar12;
    }
  }
  else {
    *type = TRIANGLE_CONTACT_A;
  }
LAB_001347c3:
  vVar26.z = fVar19;
  vVar26.x = (float)(int)uVar6;
  vVar26.y = (float)(int)((ulong)uVar6 >> 0x20);
  return vVar26;
}

Assistant:

vec3 closest_point_point_triangle(vec3 p, vec3 a, vec3 b, vec3 c, triangle_contact_type_t *type) {
    vec3 ab = vec3_subtract(b, a);
    vec3 ac = vec3_subtract(c, a);
    vec3 ap = vec3_subtract(p, a);
    float d1 = vec3_dot(ab, ap);
    float d2 = vec3_dot(ac, ap);
    if (d1 <= 0.0f && d2 <= 0.0f) {
        *type = TRIANGLE_CONTACT_A;
        return a;
    }

    vec3 bp = vec3_subtract(p, b);
    float d3 = vec3_dot(ab, bp);
    float d4 = vec3_dot(ac, bp);
    if (d3 >= 0.0f && d4 <= d3) {
        *type = TRIANGLE_CONTACT_B;
        return b; 
    }

    float vc = d1*d4 - d3*d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        *type = TRIANGLE_CONTACT_AB;
        float v = d1 / (d1 - d3);
        return vec3_add(a, vec3_scale(ab, v));
    }

    vec3 cp = vec3_subtract(p, c);
    float d5 = vec3_dot(ab, cp);
    float d6 = vec3_dot(ac, cp);
    if (d6 >= 0.0f && d5 <= d6) {
        *type = TRIANGLE_CONTACT_C;
        return c;
    }

    float vb = d5*d2 - d1*d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        *type = TRIANGLE_CONTACT_AC;
        float w = d2 / (d2 - d6);
        return vec3_add(a, vec3_scale(ac, w));
    }

    float va = d3*d6 - d5*d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        *type = TRIANGLE_CONTACT_BC;
        float w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        return vec3_add(b, vec3_scale(vec3_subtract(c, b), w));
    }

    *type = TRIANGLE_CONTACT_FACE;
    float denom = 1.0f / (va + vb + vc);
    float v = vb * denom;
    float w = vc * denom;
    return vec3_add(vec3_add(a, vec3_scale(ab, v)), vec3_scale(ac, w));
}